

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O2

void pcs_free(PrimeCandidateSource *s)

{
  size_t i;
  ulong uVar1;
  
  mp_free(s->limit);
  mp_free(s->factor);
  mp_free(s->addend);
  for (uVar1 = 0; uVar1 < s->nkps; uVar1 = uVar1 + 1) {
    mp_free(s->kps[uVar1]);
  }
  safefree(s->avoids);
  safefree(s->kps);
  safefree(s);
  return;
}

Assistant:

void pcs_free(PrimeCandidateSource *s)
{
    mp_free(s->limit);
    mp_free(s->factor);
    mp_free(s->addend);
    for (size_t i = 0; i < s->nkps; i++)
        mp_free(s->kps[i]);
    sfree(s->avoids);
    sfree(s->kps);
    sfree(s);
}